

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  bool bVar1;
  long in_RSI;
  Mat *in_RDI;
  Mat weight_data_int8_scales_g;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt_q;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int x;
  Mat *in_stack_fffffffffffffe70;
  Option *opt_00;
  Mat *scale_data;
  Mat *dst;
  Mat *src;
  int local_78;
  Allocator local_60 [9];
  long local_18;
  int local_4;
  
  if ((((*(byte *)(in_RSI + 0x1e) & 1) != 0) && (in_RDI[5].elemsize == 4)) && (in_RDI[3].d != 0)) {
    local_18 = in_RSI;
    ncnn::Mat::Mat(in_stack_fffffffffffffe70,(int)((ulong)in_RDI >> 0x20),
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),local_60);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    x = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe64);
    if (bVar1) {
      local_4 = -100;
      bVar1 = true;
    }
    else {
      for (local_78 = 0; local_78 < in_RDI[3].h; local_78 = local_78 + 1) {
        opt_00 = *(Option **)(local_18 + 0x10);
        scale_data = *(Mat **)(local_18 + 0x18);
        src = *(Mat **)(local_18 + 0x28);
        dst = (Mat *)(*(ulong *)(local_18 + 0x20) & 0xffffffffffffff);
        ncnn::Mat::range(in_RDI,x,in_stack_fffffffffffffe60);
        ncnn::Mat::range(in_RDI,x,in_stack_fffffffffffffe60);
        ncnn::Mat::range(in_RDI,x,in_stack_fffffffffffffe60);
        quantize_to_int8(src,dst,scale_data,opt_00);
        ncnn::Mat::~Mat((Mat *)0x60d5fc);
        ncnn::Mat::~Mat((Mat *)0x60d606);
        ncnn::Mat::~Mat((Mat *)0x60d613);
      }
      ncnn::Mat::operator=(in_RDI,(Mat *)CONCAT44(x,in_stack_fffffffffffffe60));
      bVar1 = false;
    }
    ncnn::Mat::~Mat((Mat *)0x60d6bf);
    if (bVar1) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}